

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O0

RegEx * YAML::Exp::KeyInFlow(void)

{
  int iVar1;
  undefined8 in_stack_ffffffffffffffc8;
  char ch;
  RegEx *in_stack_ffffffffffffffd0;
  RegEx *in_stack_fffffffffffffff0;
  RegEx *in_stack_fffffffffffffff8;
  
  ch = (char)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  if (KeyInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&KeyInFlow()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(in_stack_ffffffffffffffd0,ch);
      BlankOrBreak();
      YAML::operator+(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
      RegEx::~RegEx((RegEx *)0xf1755e);
      __cxa_atexit(RegEx::~RegEx,&KeyInFlow::e,&__dso_handle);
      __cxa_guard_release(&KeyInFlow()::e);
    }
  }
  return &KeyInFlow::e;
}

Assistant:

inline const RegEx& KeyInFlow() {
  static const RegEx e = RegEx('?') + BlankOrBreak();
  return e;
}